

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Performance::ShaderCompilerCase::logProgramData
          (ShaderCompilerCase *this,BuildInfo *buildInfo,ProgramContext *progCtx)

{
  TestLog *this_00;
  size_t in_RCX;
  size_t sVar1;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int __fd;
  undefined1 auStack_e8 [40];
  LogShader local_c0;
  LogShader local_70;
  
  this_00 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::LogShaderProgram::LogShaderProgram
            ((LogShaderProgram *)auStack_e8,buildInfo->linkSuccess,&(buildInfo->logs).link);
  __fd = (int)this_00;
  tcu::LogShaderProgram::write((LogShaderProgram *)auStack_e8,__fd,__buf,in_RCX);
  sVar1 = (size_t)buildInfo->vertCompileSuccess;
  tcu::LogShader::LogShader
            (&local_70,QP_SHADER_TYPE_VERTEX,&progCtx->vertShaderSource,
             buildInfo->vertCompileSuccess,&(buildInfo->logs).vert);
  tcu::LogShader::write(&local_70,__fd,__buf_00,sVar1);
  sVar1 = (size_t)buildInfo->fragCompileSuccess;
  tcu::LogShader::LogShader
            (&local_c0,QP_SHADER_TYPE_FRAGMENT,&progCtx->fragShaderSource,
             buildInfo->fragCompileSuccess,&(buildInfo->logs).frag);
  tcu::LogShader::write(&local_c0,__fd,__buf_01,sVar1);
  tcu::TestLog::endShaderProgram(this_00);
  tcu::LogShader::~LogShader(&local_c0);
  tcu::LogShader::~LogShader(&local_70);
  std::__cxx11::string::~string((string *)(auStack_e8 + 8));
  return;
}

Assistant:

void ShaderCompilerCase::logProgramData (const BuildInfo& buildInfo, const ProgramContext& progCtx) const
{
	m_testCtx.getLog() << TestLog::ShaderProgram(buildInfo.linkSuccess, buildInfo.logs.link)
					   << TestLog::Shader(QP_SHADER_TYPE_VERTEX,	progCtx.vertShaderSource, buildInfo.vertCompileSuccess, buildInfo.logs.vert)
					   << TestLog::Shader(QP_SHADER_TYPE_FRAGMENT,	progCtx.fragShaderSource, buildInfo.fragCompileSuccess, buildInfo.logs.frag)
					   << TestLog::EndShaderProgram;
}